

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O1

HighsStatus
normaliseNames(HighsLogOptions *log_options,string *name_type,HighsInt num_name,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *names,HighsInt *max_name_length)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  HighsStatus HVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  uint __len;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  string __str;
  string name_prefix;
  char *local_90 [2];
  char local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar13 = *max_name_length;
  iVar12 = 0;
  std::__cxx11::string::substr((ulong)local_50,(ulong)name_type);
  uVar10 = (ulong)(uint)num_name;
  if (0 < num_name) {
    lVar9 = 0;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + (uint)(*(int *)((long)&((names->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_string_length + lVar9) == 0);
      lVar9 = lVar9 + 0x20;
    } while (uVar10 << 5 != lVar9);
    bVar2 = true;
    if (iVar11 != 0) goto LAB_0024c5b5;
  }
  if (0 < num_name) {
    lVar9 = 0;
    iVar12 = 0;
    do {
      iVar11 = *(int *)((long)&((names->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                       lVar9);
      if (iVar12 <= iVar11) {
        iVar12 = iVar11;
      }
      lVar9 = lVar9 + 0x20;
    } while (uVar10 << 5 != lVar9);
  }
  *max_name_length = iVar12;
  bVar2 = iVar13 < iVar12;
LAB_0024c5b5:
  if (bVar2 == false) {
    bVar3 = hasNamesWithSpaces(log_options,num_name,names);
  }
  else {
    highsLogUser(log_options,kWarning,
                 "There are empty or excessively-long %s names: using constructed names with prefix \"%s\"\n"
                 ,(name_type->_M_dataplus)._M_p,local_50[0]);
    if (num_name < 1) {
      bVar3 = false;
    }
    else {
      uVar14 = 0;
      do {
        __len = 1;
        if (9 < uVar14) {
          uVar1 = 4;
          uVar7 = uVar14;
          do {
            __len = uVar1;
            uVar4 = (uint)uVar7;
            if (uVar4 < 100) {
              __len = __len - 2;
              goto LAB_0024c64a;
            }
            if (uVar4 < 1000) {
              __len = __len - 1;
              goto LAB_0024c64a;
            }
            if (uVar4 < 10000) goto LAB_0024c64a;
            uVar7 = (uVar7 & 0xffffffff) / 10000;
            uVar1 = __len + 4;
          } while (99999 < uVar4);
          __len = __len + 1;
        }
LAB_0024c64a:
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct((ulong)local_90,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_90[0],__len,(uint)uVar14);
        plVar6 = (long *)std::__cxx11::string::replace
                                   ((ulong)local_90,0,(char *)0x0,(ulong)local_50[0]);
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_60 = *plVar8;
          lStack_58 = plVar6[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar8;
          local_70 = (long *)*plVar6;
        }
        local_68 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)
                   ((names->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar14),(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar10);
      bVar3 = false;
    }
  }
  if (num_name < 1) {
    iVar13 = 0;
  }
  else {
    lVar9 = 0;
    iVar13 = 0;
    do {
      iVar12 = *(int *)((long)&((names->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                       lVar9);
      if (iVar13 <= iVar12) {
        iVar13 = iVar12;
      }
      lVar9 = lVar9 + 0x20;
    } while (uVar10 << 5 != lVar9);
  }
  *max_name_length = iVar13;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  HVar5 = kError;
  if (iVar13 < 9) {
    HVar5 = (uint)bVar2;
  }
  if (bVar3 == false) {
    HVar5 = (uint)bVar2;
  }
  return HVar5;
}

Assistant:

HighsStatus normaliseNames(const HighsLogOptions& log_options,
                           const std::string name_type, const HighsInt num_name,
                           std::vector<std::string>& names,
                           HighsInt& max_name_length) {
  // Record the desired maximum name length
  HighsInt desired_max_name_length = max_name_length;
  // First look for empty names
  HighsInt num_empty_name = 0;
  std::string name_prefix = name_type.substr(0, 1);
  bool names_with_spaces = false;
  for (HighsInt ix = 0; ix < num_name; ix++) {
    if ((HighsInt)names[ix].length() == 0) num_empty_name++;
  }
  // If there are no empty names - in which case they will all be
  // replaced - find the maximum name length
  if (!num_empty_name) max_name_length = maxNameLength(num_name, names);
  bool construct_names =
      num_empty_name || max_name_length > desired_max_name_length;
  if (construct_names) {
    // Construct names, either because they are empty names, or
    // because the existing names are too long

    highsLogUser(log_options, HighsLogType::kWarning,
                 "There are empty or excessively-long %s names: using "
                 "constructed names with prefix \"%s\"\n",
                 name_type.c_str(), name_prefix.c_str());
    for (HighsInt ix = 0; ix < num_name; ix++)
      names[ix] = name_prefix + std::to_string(ix);
  } else {
    // Using original names, so look to see whether there are names with spaces
    names_with_spaces = hasNamesWithSpaces(log_options, num_name, names);
  }
  // Find the final maximum name length
  max_name_length = maxNameLength(num_name, names);
  // Can't have names with spaces and more than 8 characters
  if (max_name_length > 8 && names_with_spaces) return HighsStatus::kError;
  if (construct_names) return HighsStatus::kWarning;
  return HighsStatus::kOk;
}